

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
::addCommand<char_const(&)[7]>
          (API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
           *this,char (*name) [7],ValueOptions opt,bool isSubCommandRequired,String *desc,
          String *longDesc,String *defaultValue,String *valueSpecifier)

{
  ulong uVar1;
  long in_RSI;
  API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  byte in_R8B;
  ArgPtr *in_stack_00000028;
  CmdLine *in_stack_00000030;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> arg;
  Command *c;
  unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> cmd;
  bool in_stack_000000e3;
  ValueOptions in_stack_000000e4;
  char (*in_stack_000000e8) [7];
  Command *in_stack_000000f0;
  pointer in_stack_ffffffffffffff48;
  Command *in_stack_ffffffffffffff50;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *this_00;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff60;
  unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> local_60;
  type local_50;
  Deleter<Args::ArgIface> local_45 [13];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_38;
  byte local_1d;
  
  local_1d = in_R8B & 1;
  operator_new(0xf0);
  Command::Command<char_const(&)[7]>
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e3);
  Deleter<Args::ArgIface>::Deleter(local_45,true);
  std::unique_ptr<Args::Command,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x159ee8);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x159f06);
    Command::setDescription(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x159f6d);
    Command::setLongDescription(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x159f9f);
    Command::setDefaultValue(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x159fd1);
    Command::setValueSpecifier(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
  }
  this_00 = &local_38;
  local_50 = std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator*
                       ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)
                        this_00);
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::Command,Args::details::Deleter<Args::ArgIface>,void>
            (in_stack_ffffffffffffff60,&local_60);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            (this_00,(unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                     in_stack_ffffffffffffff48);
  CmdLine::addArg(in_stack_00000030,in_stack_00000028);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  ::API(in_RDI,*(CmdLine **)(in_RSI + 0x10),local_50);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  return in_RDI;
}

Assistant:

API< PARENT, Command, ARGPTR, false > addCommand(
		//! Name of the group.
		NAME && name,
		//! Value type.
		ValueOptions opt = ValueOptions::NoValue,
		//! Is sub-command required?
		bool isSubCommandRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{
		auto cmd = std::unique_ptr< Command, details::Deleter< ArgIface > > (
			new Command( std::forward< NAME > ( name ), opt, isSubCommandRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			cmd->setDescription( desc );

		if( !longDesc.empty() )
			cmd->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			cmd->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			cmd->setValueSpecifier( valueSpecifier );

		Command & c = *cmd;

		ARGPTR arg = std::move( cmd );

		m_self.addArg( std::move( arg ) );

		return API< PARENT, Command, ARGPTR, false > ( m_self, c );
	}